

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall IMLE::getForwardSolutions(IMLE *this)

{
  double dVar1;
  reference pFVar2;
  Scalar *pSVar3;
  reference piVar4;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pMVar5;
  long in_RDI;
  Scal SVar6;
  Scal SVar7;
  int k;
  int j;
  ArrayX sumInvRxj;
  ArrayX sumInvRj;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  *in_stack_fffffffffffffc68;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_fffffffffffffc70;
  allocator_type *in_stack_fffffffffffffc78;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffc80;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  *in_stack_fffffffffffffc88;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffc90;
  reference in_stack_fffffffffffffcc0;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffcc8;
  int local_21c;
  int local_58;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_50 [2];
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_20;
  
  std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::allocator
            ((allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x2fdec1);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *)in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88,
           (value_type *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~allocator
            ((allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x2fdef5);
  std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::allocator
            ((allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x2fdf2f);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *)in_stack_fffffffffffffc90,(size_type)in_stack_fffffffffffffc88,
           (value_type *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~allocator
            ((allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x2fdf63);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::clear((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           *)0x2fdf77);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::clear((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           *)0x2fdf8d);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x2fdfa3);
  for (local_58 = 0; local_58 < *(int *)(in_RDI + 200); local_58 = local_58 + 1) {
    pFVar2 = std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
             ::operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_58);
    SVar6 = LinearExpert::getGamma(&pFVar2->super_LinearExpert);
    pFVar2 = std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
             ::operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_58);
    SVar7 = LinearExpert::get_p_z(&pFVar2->super_LinearExpert);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x140),(long)local_58);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffffc70,(Index)in_stack_fffffffffffffc68);
    dVar1 = *pSVar3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffc70,(Index)in_stack_fffffffffffffc68);
    *pSVar3 = SVar6 * SVar7 + dVar1;
    pFVar2 = std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
             ::operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_58);
    LinearExpert::getPredXInvVar(&pFVar2->super_LinearExpert);
    pFVar2 = std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
             ::operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_58);
    LinearExpert::get_p_z(&pFVar2->super_LinearExpert);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
              (in_stack_fffffffffffffc70,(Index)in_stack_fffffffffffffc68);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
              (in_stack_fffffffffffffcc8,(double *)in_stack_fffffffffffffcc0);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
               in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
    asDiagonal((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
               in_stack_fffffffffffffc70);
    pFVar2 = std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
             ::operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_58);
    LinearExpert::getPredX(&pFVar2->super_LinearExpert);
    Eigen::
    DiagonalBase<Eigen::DiagonalWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>>
    ::operator*((DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                 *)in_stack_fffffffffffffc80,
                (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffc78);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
               in_stack_fffffffffffffc70,
               (DenseBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
                *)in_stack_fffffffffffffc68);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78);
    in_stack_fffffffffffffcc8 =
         (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
         std::vector<int,_std::allocator<int>_>::operator[]
                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x140),(long)local_58);
    in_stack_fffffffffffffcc0 =
         std::
         vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
         ::operator[](&local_20,(long)*(int *)in_stack_fffffffffffffcc8);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78);
    piVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x140),(long)local_58);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::operator[](local_50,(long)*piVar4);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  }
  for (local_21c = 0; local_21c < *(int *)(in_RDI + 0x284); local_21c = local_21c + 1) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_stack_fffffffffffffc70,(Index)in_stack_fffffffffffffc68);
    if ((*pSVar3 != 0.0) || (NAN(*pSVar3))) {
      pMVar5 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(in_RDI + 0x1d8);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::operator[](local_50,(long)local_21c);
      in_stack_fffffffffffffc90 =
           (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
           std::
           vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
           ::operator[](&local_20,(long)local_21c);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      cwiseQuotient<Eigen::Matrix<double,_1,1,0,_1,1>>(pMVar5,in_stack_fffffffffffffc90);
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffc70,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)in_stack_fffffffffffffc68);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)in_stack_fffffffffffffc80,(value_type *)in_stack_fffffffffffffc78);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x2fe5c4);
      in_stack_fffffffffffffc80 =
           (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(in_RDI + 0x1f0);
      pMVar5 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               std::
               vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
               ::operator[](&local_20,(long)local_21c);
      Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cwiseInverse(pMVar5);
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffc70,
                 (EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)in_stack_fffffffffffffc68);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)in_stack_fffffffffffffc80,(value_type *)in_stack_fffffffffffffc78);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x2fe641);
      in_stack_fffffffffffffc70 =
           (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)(in_RDI + 0x208);
      in_stack_fffffffffffffc78 =
           (allocator_type *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     (in_stack_fffffffffffffc70,(Index)in_stack_fffffffffffffc68);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc80,
                 (value_type *)in_stack_fffffffffffffc78);
    }
    else {
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)in_stack_fffffffffffffc80,(value_type *)in_stack_fffffffffffffc78);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)in_stack_fffffffffffffc80,(value_type *)in_stack_fffffffffffffc78);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc80,
                 (value_type *)in_stack_fffffffffffffc78);
    }
  }
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *)in_stack_fffffffffffffc90);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *)in_stack_fffffffffffffc90);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::getForwardSolutions()
{
    // Aux variables
    ArrayX sumInvRj(nSolFound, zeroX);
    ArrayX sumInvRxj(nSolFound, zeroX);

    // Clear predict data structure
    predictions.clear();
    predictionsVar.clear();
    predictionsWeight.clear();

    for(int j = 0; j < M; j++)
    {
        /* These 3 variables have already been resized in predict() */
        varPhiAuxj(j) = experts[j].getGamma() * experts[j].get_p_z() + sumW[sNearest[j]];
        fInvRj.col(j) = experts[j].getPredXInvVar() * (experts[j].get_p_z() / varPhiAuxj(j));
        invRxj.col(j) = fInvRj.col(j).asDiagonal() * experts[j].getPredX();

        sumInvRj[sNearest[j]] += fInvRj.col(j);
        sumInvRxj[sNearest[j]] += invRxj.col(j);
    }

    // Update storage results
    for( int k = 0; k < nSolFound; k++ )
    {
        if(sum_p_z(k) == 0.0)  // Not likely, but...
        {
            predictions.push_back( zeroX );
            predictionsVar.push_back( infinityX );
            predictionsWeight.push_back( 0.0 );
        }
        else
        {
            predictions.push_back( sumInvRxj[k].cwiseQuotient(sumInvRj[k]) );
            predictionsVar.push_back( sumInvRj[k].cwiseInverse() );
            predictionsWeight.push_back( sum_p_z(k) / sumAll );
        }
    }
}